

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

CBlockIndex * __thiscall CChain::FindFork(CChain *this,CBlockIndex *pindex)

{
  long lVar1;
  pointer ppCVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindex != (CBlockIndex *)0x0) {
    iVar3 = (int)((ulong)((long)(this->vChain).
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vChain).
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar3 <= pindex->nHeight) {
      pindex = CBlockIndex::GetAncestor(pindex,iVar3 + -1);
      if (pindex == (CBlockIndex *)0x0) goto LAB_008625a5;
    }
    ppCVar2 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = pindex->nHeight;
      if ((long)iVar3 < 0) {
        pCVar4 = (CBlockIndex *)0x0;
      }
      else {
        pCVar4 = (CBlockIndex *)0x0;
        if (iVar3 < (int)((ulong)((long)(this->vChain).
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2)
                         >> 3)) {
          pCVar4 = ppCVar2[iVar3];
        }
      }
      if (pCVar4 == pindex) goto LAB_008625a7;
      pindex = pindex->pprev;
    } while (pindex != (CBlockIndex *)0x0);
  }
LAB_008625a5:
  pindex = (CBlockIndex *)0x0;
LAB_008625a7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pindex;
  }
  __stack_chk_fail();
}

Assistant:

const CBlockIndex *CChain::FindFork(const CBlockIndex *pindex) const {
    if (pindex == nullptr) {
        return nullptr;
    }
    if (pindex->nHeight > Height())
        pindex = pindex->GetAncestor(Height());
    while (pindex && !Contains(pindex))
        pindex = pindex->pprev;
    return pindex;
}